

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

bignum __thiscall jbcoin::generateRootDeterministicKey(jbcoin *this,uint128 *seed)

{
  bool bVar1;
  array<unsigned_char,_20UL> *extraout_RDX;
  array<unsigned_char,_20UL> *args;
  array<unsigned_char,_20UL> *extraout_RDX_00;
  array<unsigned_char,_20UL> *extraout_RDX_01;
  int iVar2;
  int local_6c;
  array<unsigned_char,_20UL> buf;
  result_type root;
  
  openssl::bignum::bignum((bignum *)this);
  iVar2 = 0;
  args = extraout_RDX;
  do {
    do {
      buf._M_elems._0_8_ = *(undefined8 *)seed->pn;
      buf._M_elems._8_8_ = *(undefined8 *)(seed->pn + 2);
      buf._M_elems[0x10] = (uchar)((uint)iVar2 >> 0x18);
      buf._M_elems[0x11] = (uchar)((uint)iVar2 >> 0x10);
      buf._M_elems[0x12] = (uchar)((uint)iVar2 >> 8);
      buf._M_elems[0x13] = (uchar)iVar2;
      iVar2 = iVar2 + 1;
      local_6c = iVar2;
      sha512Half<std::array<unsigned_char,20ul>>(&root,(jbcoin *)&buf,args);
      beast::secure_erase<void>((jbcoin *)&buf,0x14);
      openssl::bignum::assign((bignum *)this,(uint8_t *)&root,0x20);
      beast::secure_erase<void>(&root,0x20);
      bVar1 = openssl::bignum::is_zero((bignum *)this);
      args = extraout_RDX_00;
    } while (bVar1);
    bVar1 = openssl::operator>=((bignum *)this,(bignum *)&DAT_00305ac0);
    args = extraout_RDX_01;
  } while (bVar1);
  beast::secure_erase<void>(&local_6c,4);
  return (bignum)(BIGNUM *)this;
}

Assistant:

static bignum generateRootDeterministicKey (uint128 const& seed)
{
    // find non-zero private key less than the curve's order
    bignum privKey;
    std::uint32_t seq = 0;

    do
    {
        // buf: 0                seed               16  seq  20
        //      |<--------------------------------->|<------>|
        std::array<std::uint8_t, 20> buf;
        std::copy(seed.begin(), seed.end(), buf.begin());
        copy_uint32 (buf.begin() + 16, seq++);
        auto root = sha512Half(buf);
        beast::secure_erase(buf.data(), buf.size());
        privKey.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (privKey.is_zero() || privKey >= secp256k1curve.order);
    beast::secure_erase(&seq, sizeof(seq));
    return privKey;
}